

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

CoverageIffClauseSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::CoverageIffClauseSyntax,slang::syntax::CoverageIffClauseSyntax_const&>
          (BumpAllocator *this,CoverageIffClauseSyntax *args)

{
  undefined4 uVar1;
  CoverageIffClauseSyntax *pCVar2;
  long lVar3;
  CoverageIffClauseSyntax *pCVar4;
  byte bVar5;
  
  bVar5 = 0;
  pCVar2 = (CoverageIffClauseSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((CoverageIffClauseSyntax *)this->endPtr < pCVar2 + 1) {
    pCVar2 = (CoverageIffClauseSyntax *)allocateSlow(this,0x50,8);
  }
  else {
    this->head->current = (byte *)(pCVar2 + 1);
  }
  pCVar4 = pCVar2;
  for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
    uVar1 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
    (pCVar4->super_SyntaxNode).kind = (args->super_SyntaxNode).kind;
    *(undefined4 *)&(pCVar4->super_SyntaxNode).field_0x4 = uVar1;
    args = (CoverageIffClauseSyntax *)((long)args + (ulong)bVar5 * -0x10 + 8);
    pCVar4 = (CoverageIffClauseSyntax *)((long)pCVar4 + (ulong)bVar5 * -0x10 + 8);
  }
  return pCVar2;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }